

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# average.hpp
# Opt level: O0

void __thiscall
vista::circular::example::average<double,_4UL>::push(average<double,_4UL> *this,value_type input)

{
  bool bVar1;
  reference pdVar2;
  value_type input_local;
  average<double,_4UL> *this_local;
  
  bVar1 = circular_view<double,_4UL>::full
                    (&(this->super_circular_array<double,_4UL>).super_circular_view<double,_4UL>);
  if (bVar1) {
    pdVar2 = circular_view<double,_4UL>::front
                       (&(this->super_circular_array<double,_4UL>).super_circular_view<double,_4UL>)
    ;
    this->sum = (input - *pdVar2) + this->sum;
  }
  else {
    this->sum = input + this->sum;
  }
  circular_view<double,_4UL>::push_back
            (&(this->super_circular_array<double,_4UL>).super_circular_view<double,_4UL>,input);
  return;
}

Assistant:

void push(value_type input) noexcept(std::is_nothrow_move_assignable<value_type>::value)
    {
        // Update the running sum
        if (window::full())
        {
            // Undo the effect of the entry leaving the window
            sum += input - window::front();
        }
        else
        {
            sum += input;
        }
        // Remember the input value for later use
        window::push_back(input);
    }